

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<false,_false,_false>::unfix_
          (DaTrie<false,_false,_false> *this,uint32_t node_pos,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  pointer *ppBVar1;
  pointer pBVar2;
  pointer pBVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = node_pos >> 8;
  if (this->bc_emps_ == 0) {
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar2[node_pos] =
         (Bc)((ulong)pBVar2[node_pos] & 0xffffffff00000000 | (ulong)(node_pos & 0x7fffffff));
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar2[node_pos] =
         (Bc)((ulong)pBVar2[node_pos] & 0x80000000ffffffff | (ulong)(node_pos & 0x7fffffff) << 0x20)
    ;
    this->head_pos_ = node_pos;
  }
  else {
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar2[node_pos] =
         (Bc)((ulong)pBVar2[node_pos] & 0x80000000ffffffff |
             (ulong)pBVar2[this->head_pos_] & 0x7fffffff00000000);
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar2[node_pos] =
         (Bc)((ulong)(this->head_pos_ & 0x7fffffff) | (ulong)pBVar2[node_pos] & 0xffffffff00000000);
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (ulong)pBVar2[this->head_pos_] >> 0x1d & 0x3fffffff8;
    *(ulong *)(&pBVar2->field_0x0 + uVar5) =
         *(ulong *)(&pBVar2->field_0x0 + uVar5) & 0xffffffff00000000 |
         (ulong)(node_pos & 0x7fffffff);
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar2[this->head_pos_] =
         (Bc)((ulong)pBVar2[this->head_pos_] & 0x80000000ffffffff |
             (ulong)(node_pos & 0x7fffffff) << 0x20);
  }
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start + node_pos;
  *pBVar2 = (Bc)((ulong)*pBVar2 & 0x7fffffffffffffff);
  this->bc_emps_ = this->bc_emps_ + 1;
  pBVar3 = (blocks->super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>)._M_impl.
           super__Vector_impl_data._M_start + uVar4;
  pBVar3->num_emps = pBVar3->num_emps + 1;
  if ((uVar4 == (int)((ulong)((long)(this->blocks_).
                                    super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->blocks_).
                                   super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2) - 1U) &&
     ((blocks->super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar4].num_emps == 0x100)) {
    do {
      uVar4 = uVar4 - 1;
      pop_block_(this,(int)((ulong)((long)(this->blocks_).
                                          super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->blocks_).
                                         super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) - 1,
                 &this->blocks_);
      ppBVar1 = &(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppBVar1 = *ppBVar1 + -0x100;
      pBVar3 = (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
      (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
      super__Vector_impl_data._M_finish = pBVar3;
      this->bc_emps_ = this->bc_emps_ - 0x100;
      if ((int)((ulong)((long)pBVar3 -
                       (long)(this->blocks_).
                             super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2) == 0) {
        return;
      }
    } while ((blocks->super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar4].num_emps == 0x100);
  }
  return;
}

Assistant:

void unfix_(uint32_t node_pos, std::vector<Block>& blocks) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto block_pos = node_pos / BLOCK_SIZE;

    if (bc_emps_ == 0) {
      set_next_(node_pos, node_pos);
      set_prev_(node_pos, node_pos);
      head_pos_ = node_pos;
    } else {
      set_prev_(node_pos, prev_(head_pos_));
      set_next_(node_pos, head_pos_);
      set_next_(prev_(head_pos_), node_pos);
      set_prev_(head_pos_, node_pos);
    }

    bc_[node_pos].unfix();

    ++bc_emps_;
    ++blocks[block_pos].num_emps;

    if (block_pos == num_blocks() - 1) {
      while (blocks[block_pos].num_emps == BLOCK_SIZE) {
        pop_block_();
        if (num_blocks() == 0) {
          break;
        }
        --block_pos;
      }
    }
  }